

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

void ReadScale(aiMatrix4x4 *axis,StreamReaderLE *stream)

{
  aiMatrix4x4t<float> local_98;
  undefined1 local_58 [8];
  aiMatrix4x4 scale;
  StreamReaderLE *stream_local;
  aiMatrix4x4 *axis_local;
  
  scale._56_8_ = stream;
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_58);
  local_58._0_4_ =
       Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.a3 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.b3 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.c3 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  local_58._4_4_ =
       Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.a4 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.b4 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.c4 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.a1 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.b1 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.c1 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.d1 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.a2 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.b2 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.c2 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  scale.d2 = Assimp::StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)scale._56_8_);
  aiMatrix4x4t<float>::operator*(&local_98,axis,(aiMatrix4x4t<float> *)local_58);
  memcpy(axis,&local_98,0x40);
  return;
}

Assistant:

static void ReadScale(aiMatrix4x4& axis, StreamReaderLE* stream)
{
    aiMatrix4x4 scale;
    scale.a1 = stream->GetF4();
    scale.b1 = stream->GetF4();
    scale.c1 = stream->GetF4();
    scale.d1 = stream->GetF4();
    scale.a2 = stream->GetF4();
    scale.b2 = stream->GetF4();
    scale.c2 = stream->GetF4();
    scale.d2 = stream->GetF4();
    scale.a3 = stream->GetF4();
    scale.b3 = stream->GetF4();
    scale.c3 = stream->GetF4();
    scale.d3 = stream->GetF4();
    scale.a4 = stream->GetF4();
    scale.b4 = stream->GetF4();
    scale.c4 = stream->GetF4();
    scale.d4 = stream->GetF4();

    axis = axis * scale;
}